

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

Vector __thiscall xt::vector::vec(vector *this,List *list)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Vector VVar5;
  List n;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  undefined8 local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  Object local_70;
  Object local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  peVar1 = (list->super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1->count == 0) {
    VVar5 = empty();
    _Var4 = VVar5.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    Object::Object(&local_50,&peVar1->first);
    conj(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    peVar1 = (list->super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_a8 = (peVar1->rest).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a0._M_pi =
         (peVar1->rest).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
      }
    }
    _Var4._M_pi = extraout_RDX;
    if (local_a8 != (element_type *)0x0) {
      do {
        if (local_a8->count == 0) break;
        local_98 = *(undefined8 *)this;
        local_90 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
        if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_90->_M_use_count = local_90->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_90->_M_use_count = local_90->_M_use_count + 1;
          }
        }
        Object::Object(&local_70,&local_a8->first);
        conj((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        p_Var3 = p_Stack_80;
        uVar2 = local_88;
        local_88 = 0;
        p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
        *(undefined8 *)this = uVar2;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
        }
        if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
        }
        peVar1 = (local_a8->rest).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_a0,
                   &(local_a8->rest).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        _Var4._M_pi = extraout_RDX_00;
        local_a8 = peVar1;
      } while (peVar1 != (element_type *)0x0);
    }
    if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  VVar5.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  VVar5.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Vector)VVar5.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Vector vec(List list) {
	if (list->count == 0) return empty();
	Vector ret = vector::conj(list->first);
	List n = list->rest;
	while (n && n->count) {
		ret = conj(ret, n->first);
		n = n->rest;
	}
	return ret;
	
}